

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_get_key_domain_parameters
          (psa_key_attributes_t *attributes,uint8_t *data,size_t data_size,size_t *data_length)

{
  psa_status_t pVar1;
  
  pVar1 = -0x8a;
  if (attributes->domain_parameters_size <= data_size) {
    *data_length = attributes->domain_parameters_size;
    pVar1 = 0;
    if (attributes->domain_parameters_size != 0) {
      memcpy(data,attributes->domain_parameters,attributes->domain_parameters_size);
      pVar1 = 0;
    }
  }
  return pVar1;
}

Assistant:

psa_status_t psa_get_key_domain_parameters(
    const psa_key_attributes_t *attributes,
    uint8_t *data, size_t data_size, size_t *data_length )
{
    if( attributes->domain_parameters_size > data_size )
        return( PSA_ERROR_BUFFER_TOO_SMALL );
    *data_length = attributes->domain_parameters_size;
    if( attributes->domain_parameters_size != 0 )
        memcpy( data, attributes->domain_parameters,
                attributes->domain_parameters_size );
    return( PSA_SUCCESS );
}